

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

unsigned_long __thiscall
mp::internal::TextReader<fmt::Locale>::ReadUInt<unsigned_long>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  unsigned_long value;
  unsigned_long local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  SkipSpace(this);
  local_30 = 0;
  bVar1 = ReadIntWithoutSign<unsigned_long>(this,&local_30);
  if (!bVar1) {
    local_18.field_1.values_ = (Value *)&local_28;
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x392142,&local_18);
  }
  return local_30;
}

Assistant:

Int ReadUInt() {
    SkipSpace();
    Int value = 0;
    if (!ReadIntWithoutSign(value))
      ReportError("expected unsigned integer");
    return value;
  }